

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpVirtualDir_set_CloseCallback(VDCallback_Close callback)

{
  if (callback != (VDCallback_Close)0x0) {
    virtualDirCallback.close = callback;
    return 0;
  }
  return -0x65;
}

Assistant:

int UpnpVirtualDir_set_CloseCallback(VDCallback_Close callback)
{
	int ret = UPNP_E_SUCCESS;
	if (!callback) {
		ret = UPNP_E_INVALID_PARAM;
	} else {
		virtualDirCallback.close = callback;
	}

	return ret;
}